

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement_data.cpp
# Opt level: O0

bool __thiscall
duckdb::PreparedStatementData::TryGetType
          (PreparedStatementData *this,string *identifier,LogicalType *result)

{
  bool bVar1;
  LogicalTypeId LVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_true>
  this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_true>
  other;
  BoundParameterData *pBVar3;
  Value *this_01;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>
  *in_RDI;
  iterator it;
  bool local_1;
  
  this_00._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>
       ::find(in_RDI,(key_type *)0x88e60d);
  other._M_cur = (__node_type *)
                 ::std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>
                 ::end(in_RDI);
  bVar1 = ::std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_true>
                      *)&stack0xffffffffffffffd8,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_true>
                      *)&stack0xffffffffffffffd0);
  if (bVar1) {
    local_1 = false;
  }
  else {
    ::std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_false,_true>
                  *)0x88e650);
    pBVar3 = shared_ptr<duckdb::BoundParameterData,_true>::operator->
                       ((shared_ptr<duckdb::BoundParameterData,_true> *)other._M_cur);
    LVar2 = LogicalType::id(&pBVar3->return_type);
    if (LVar2 == INVALID) {
      ::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_false,_true>
                    *)0x88e69f);
      pBVar3 = shared_ptr<duckdb::BoundParameterData,_true>::operator->
                         ((shared_ptr<duckdb::BoundParameterData,_true> *)other._M_cur);
      this_01 = BoundParameterData::GetValue(pBVar3);
      Value::type(this_01);
      LogicalType::operator=((LogicalType *)this_00._M_cur,(LogicalType *)other._M_cur);
    }
    else {
      ::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_false,_true>
                    *)0x88e676);
      shared_ptr<duckdb::BoundParameterData,_true>::operator->
                ((shared_ptr<duckdb::BoundParameterData,_true> *)other._M_cur);
      LogicalType::operator=((LogicalType *)this_00._M_cur,(LogicalType *)other._M_cur);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool PreparedStatementData::TryGetType(const string &identifier, LogicalType &result) {
	auto it = value_map.find(identifier);
	if (it == value_map.end()) {
		return false;
	}
	if (it->second->return_type.id() != LogicalTypeId::INVALID) {
		result = it->second->return_type;
	} else {
		result = it->second->GetValue().type();
	}
	return true;
}